

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O1

int __thiscall
ary::TemplatePlaneVerifier::verify
          (TemplatePlaneVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Mat *image;
  ulong uVar1;
  _OutputArray *p_Var2;
  undefined8 uVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  TemplatePlaneVerifier *this_00;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> mask_points;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> template_points;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> bounds_points;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> model_points;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points;
  Mat homography;
  Mat verification;
  undefined1 local_248 [8];
  pointer pPStack_240;
  pointer local_238;
  void *local_228;
  undefined1 *puStack_220;
  Size local_218;
  _InputArray local_210;
  void *local_1f8;
  _InputArray *p_Stack_1f0;
  Size local_1e8;
  undefined8 uStack_1e0;
  void *local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  double local_1b8;
  CameraModel *local_1b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a8;
  CameraModel *local_1a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  _InputArray local_190;
  void *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  _InputArray local_158;
  _OutputArray local_140;
  _InputArray local_128;
  Mat local_110;
  ulong local_b0;
  undefined1 local_a8 [16];
  uchar *local_98;
  Scalar local_48;
  
  local_1d8 = (void *)0x0;
  uStack_1d0 = 0;
  local_1c8 = 0;
  local_110.flags = 0;
  local_110.dims = 0;
  local_110.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&local_1d8,
             (Point3_<float> *)&local_110);
  local_110.flags = (int)(float)(this->model_size).width;
  local_110.dims = 0;
  local_110.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&local_1d8,
             (Point3_<float> *)&local_110);
  local_110.flags = (int)(float)(this->model_size).width;
  local_110.dims = (int)(float)(this->model_size).height;
  local_110.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&local_1d8,
             (Point3_<float> *)&local_110);
  local_110.dims = (int)(float)(this->model_size).height;
  local_110.flags = 0;
  local_110.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&local_1d8,
             (Point3_<float> *)&local_110);
  local_168 = 0;
  local_178 = (void *)0x0;
  uStack_170 = 0;
  local_1e8.width = 0;
  local_1e8.height = 0;
  local_1f8 = (void *)CONCAT44(local_1f8._4_4_,-0x7efcffeb);
  p_Stack_1f0 = (_InputArray *)&local_1d8;
  (**(code **)(**(long **)sig + 0x10))(local_248);
  local_228 = (void *)CONCAT44(local_228._4_4_,-0x3efdfffb);
  local_218.width = 1;
  local_218.height = 3;
  puStack_220 = local_248;
  (**(code **)(**(long **)sig + 0x10))(&local_158);
  local_210.obj = (void *)((long)&local_158.obj + 4);
  local_210.flags = -0x3efdfffb;
  local_210.sz.width = 1;
  local_210.sz.height = 3;
  CameraUser::getCameraModel((CameraUser *)this);
  CameraModel::getIntrinsics(local_1a0);
  local_190.flags = -0x3efdfffb;
  local_190.sz.width = 3;
  local_190.sz.height = 3;
  local_190.obj = local_a8;
  CameraUser::getCameraModel((CameraUser *)this);
  CameraModel::getDistortion(&local_110,local_1b0);
  local_128.sz.width = 0;
  local_128.sz.height = 0;
  local_128.flags = 0x1010000;
  local_140.super__InputArray.sz.width = 0;
  local_140.super__InputArray.sz.height = 0;
  local_140.super__InputArray.flags = -0x7dfcfff3;
  local_140.super__InputArray.obj = &local_178;
  local_128.obj = &local_110;
  p_Var2 = (_OutputArray *)cv::noArray();
  cv::projectPoints((_InputArray *)&local_1f8,(_InputArray *)&local_228,&local_210,&local_190,
                    &local_128,&local_140,p_Var2,0.0);
  cv::Mat::~Mat(&local_110);
  if (local_1a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8);
  }
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
  local_218.width = 0;
  local_218.height = 0;
  local_228 = (void *)0x0;
  puStack_220 = (undefined1 *)0x0;
  local_110.flags = 0;
  local_110.dims = 0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_228,
             (Point_<float> *)&local_110);
  local_110.flags = (int)(float)(this->model_template).cols;
  local_110.dims = 0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_228,
             (Point_<float> *)&local_110);
  local_110.flags = (int)(float)(this->model_template).cols;
  local_110.dims = (int)(float)(this->model_template).rows;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_228,
             (Point_<float> *)&local_110);
  local_110.dims = (int)(float)(this->model_template).rows;
  local_110.flags = 0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_228,
             (Point_<float> *)&local_110);
  local_98 = (uchar *)0x0;
  local_a8._0_4_ = -0x7efcfff3;
  local_1e8.width = 0;
  local_1e8.height = 0;
  local_1f8 = (void *)CONCAT44(local_1f8._4_4_,-0x7efcfff3);
  p_Stack_1f0 = (_InputArray *)&local_228;
  local_a8._8_8_ = &local_178;
  cv::getPerspectiveTransform((_InputArray *)&local_110,(_InputArray *)local_a8,(int)&local_1f8);
  cv::Mat::Mat((Mat *)local_a8);
  local_238 = (pointer)0x0;
  local_248._0_4_ = 2.3693558e-38;
  local_210.sz.width = 0;
  local_210.sz.height = 0;
  local_210.flags = 0x2010000;
  local_158.sz.width = 0;
  local_158.sz.height = 0;
  local_158.flags = 0x1010000;
  uVar1 = *(ulong *)(this->model_template).size.p;
  local_b0 = uVar1 << 0x20 | uVar1 >> 0x20;
  local_1e8.width = 0;
  local_1e8.height = 0;
  uStack_1e0 = 0;
  local_1f8 = (void *)0x0;
  p_Stack_1f0 = (_InputArray *)0x0;
  pPStack_240 = (pointer)ctx;
  local_210.obj = (Mat *)local_a8;
  local_158.obj = &local_110;
  cv::warpPerspective();
  local_1e8.width = 0;
  local_1e8.height = 0;
  local_1f8 = (void *)0x0;
  p_Stack_1f0 = (_InputArray *)0x0;
  local_248._0_4_ = 0.0;
  local_248._4_4_ = 0.0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_1f8,
             (Point_<float> *)local_248);
  local_248._4_4_ = 0;
  local_248._0_4_ = (float)*(int *)(ctx + 0xc);
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_1f8,
             (Point_<float> *)local_248);
  local_248._4_4_ = (float)*(int *)(ctx + 8);
  local_248._0_4_ = (float)*(int *)(ctx + 0xc);
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_1f8,
             (Point_<float> *)local_248);
  local_248 = (undefined1  [8])((ulong)(uint)(float)*(int *)(ctx + 8) << 0x20);
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_1f8,
             (Point_<float> *)local_248);
  local_238 = (pointer)0x0;
  local_248._0_4_ = 0.0;
  local_248._4_4_ = 0.0;
  pPStack_240 = (pointer)0x0;
  local_210.sz.width = 0;
  local_210.sz.height = 0;
  local_210.flags = -0x7efcfff3;
  local_158.sz.width = 0;
  local_158.sz.height = 0;
  local_158.flags = -0x7dfcfff3;
  local_190.sz.width = 0;
  local_190.sz.height = 0;
  local_190.flags = 0x1010000;
  local_210.obj = (vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&local_1f8;
  local_190.obj = &local_110;
  local_158.obj = (Point_<float> *)local_248;
  cv::perspectiveTransform(&local_210,(_OutputArray *)&local_158,&local_190);
  local_158.flags = 0;
  local_158._4_4_ = 0;
  local_210.flags = -0x3efdfffa;
  local_210.sz.width = 1;
  local_210.sz.height = 1;
  local_210.obj = &local_158;
  cv::noArray();
  image = &this->model_mask;
  cv::Mat::setTo((_InputArray *)image,&local_210);
  local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
  local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 0.0;
  local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_48.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
  this_00 = (TemplatePlaneVerifier *)image;
  fillPolygon(image,(vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_248,
              &local_48);
  local_1b8 = match_template(this_00,&this->model_template,(Mat *)local_a8,image);
  if ((Point_<float>)local_248 != (Point_<float>)0x0) {
    operator_delete((void *)local_248);
  }
  if (local_1f8 != (void *)0x0) {
    operator_delete(local_1f8);
  }
  cv::Mat::~Mat((Mat *)local_a8);
  uVar3 = cv::Mat::~Mat(&local_110);
  if (local_228 != (void *)0x0) {
    operator_delete(local_228);
    uVar3 = extraout_RAX;
  }
  if (local_178 != (void *)0x0) {
    operator_delete(local_178);
    uVar3 = extraout_RAX_00;
  }
  if (local_1d8 != (void *)0x0) {
    operator_delete(local_1d8);
    uVar3 = extraout_RAX_01;
  }
  return (int)CONCAT71((int7)((ulong)uVar3 >> 8),0.4 < local_1b8);
}

Assistant:

bool TemplatePlaneVerifier::verify(const Mat& image, const SharedPlanarLocalization& localization) {

	vector<Point3f> model_points;
	model_points.push_back(Point3f(0, 0, 0));
	model_points.push_back(Point3f(model_size.width, 0, 0));
	model_points.push_back(Point3f(model_size.width, model_size.height, 0));
	model_points.push_back(Point3f(0, model_size.height, 0));

	vector<Point2f> image_points;
	projectPoints(model_points, localization->getCameraPosition().rotation, localization->getCameraPosition().translation, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion(), image_points);

	vector<Point2f> template_points;
	template_points.push_back(Point2f(0, 0));
	template_points.push_back(Point2f(model_template.cols, 0));
	template_points.push_back(Point2f(model_template.cols, model_template.rows));
	template_points.push_back(Point2f(0, model_template.rows));

	Mat homography = getPerspectiveTransform(image_points, template_points);

	Mat verification;
	cv::warpPerspective(image, verification, homography, model_template.size());

	vector<Point2f> bounds_points;
	bounds_points.push_back(Point2f(0, 0));
	bounds_points.push_back(Point2f(image.cols, 0));
	bounds_points.push_back(Point2f(image.cols, image.rows));
	bounds_points.push_back(Point2f(0, image.rows));
	vector<Point2f> mask_points;

	perspectiveTransform(bounds_points, mask_points, homography);

	model_mask.setTo(0);

	fillPolygon(model_mask, mask_points, Scalar(255));

	double match_score = match_template(model_template, verification, model_mask);

	return (match_score > 0.4);

}